

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_ExtensionRangeFeaturesOverride_Test::
FeaturesTest_ExtensionRangeFeaturesOverride_Test
          (FeaturesTest_ExtensionRangeFeaturesOverride_Test *this)

{
  FeaturesTest::FeaturesTest(&this->super_FeaturesTest);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_015faf28;
  return;
}

Assistant:

TEST_F(FeaturesTest, ExtensionRangeFeaturesOverride) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    dependency: "google/protobuf/unittest_features.proto"
    options {
      features {
        [pb.test] { multiple_feature: VALUE2 file_feature: VALUE4 }
      }
    }
    message_type {
      name: "Foo"
      options {
        features {
          [pb.test] { multiple_feature: VALUE5 message_feature: VALUE5 }
        }
      }
      extension_range {
        start: 1
        end: 100
        options {
          features {
            [pb.test] { multiple_feature: VALUE9 }
          }
        }
      }
    }
  )pb");
  const Descriptor::ExtensionRange* range =
      file->message_type(0)->extension_range(0);
  EXPECT_THAT(range->options(), EqualsProto(""));
  EXPECT_EQ(GetFeatures(range).GetExtension(pb::test).multiple_feature(),
            pb::VALUE9);
  EXPECT_EQ(GetFeatures(range).GetExtension(pb::test).message_feature(),
            pb::VALUE5);
  EXPECT_EQ(GetFeatures(range).GetExtension(pb::test).file_feature(),
            pb::VALUE4);
}